

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

double soplex::MPSgetRHS<double>(double left,double right)

{
  double *pdVar1;
  SPxInternalCodeException *this;
  double dVar2;
  allocator local_49;
  double local_48;
  double local_40;
  string local_38;
  
  local_48 = right;
  local_40 = left;
  pdVar1 = (double *)infinity();
  dVar2 = local_40;
  if (local_40 <= -*pdVar1) {
    pdVar1 = (double *)infinity();
    dVar2 = local_48;
    if (*pdVar1 <= local_48) {
      this = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_38,"XMPSWR01 This should never happen.",&local_49);
      SPxInternalCodeException::SPxInternalCodeException(this,&local_38);
      __cxa_throw(this,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
  }
  return dVar2;
}

Assistant:

static R MPSgetRHS(R left, R right)
{
   R rhsval;

   if(left > R(-infinity))   /// This includes ranges
      rhsval = left;
   else if(right <  R(infinity))
      rhsval = right;
   else
      throw SPxInternalCodeException("XMPSWR01 This should never happen.");

   return rhsval;
}